

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_tree.c
# Opt level: O0

int context_push(context_t *ctx,yajl_val v)

{
  void *__s;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  stack_elem_t *stack;
  int local_4;
  
  __s = malloc(0x18);
  if (__s == (void *)0x0) {
    if (in_RDI[2] != 0) {
      snprintf((char *)in_RDI[2],in_RDI[3],"Out of memory");
    }
    local_4 = 0xc;
  }
  else {
    memset(__s,0,0x18);
    *(undefined8 *)((long)__s + 8) = in_RSI;
    *(undefined8 *)((long)__s + 0x10) = *in_RDI;
    *in_RDI = __s;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int context_push(context_t *ctx, yajl_val v)
{
    stack_elem_t *stack;

    stack = malloc (sizeof (*stack));
    if (stack == NULL)
        RETURN_ERROR (ctx, ENOMEM, "Out of memory");
    memset (stack, 0, sizeof (*stack));

    assert ((ctx->stack == NULL)
            || YAJL_IS_OBJECT (v)
            || YAJL_IS_ARRAY (v));

    stack->value = v;
    stack->next = ctx->stack;
    ctx->stack = stack;

    return (0);
}